

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pRVar1;
  bool bVar2;
  RegularExpression *regex;
  pointer pRVar3;
  RegularExpression *regex_1;
  bool bVar4;
  RegularExpressionMatch match;
  RegularExpressionMatch local_d8;
  
  local_d8.startp[0] = (char *)0x0;
  local_d8.endp[0] = (char *)0x0;
  local_d8.searchstring = (char *)0x0;
  pRVar3 = (this->PostIncludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->PostIncludeRegexes).
           super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pRVar3 == pRVar1) {
      pRVar3 = (this->PostExcludeRegexes).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar1 = (this->PostExcludeRegexes).
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar4 = pRVar3 == pRVar1;
        bVar2 = !bVar4;
        if (bVar4) {
          return bVar2;
        }
        bVar4 = cmsys::RegularExpression::find(pRVar3,(name->_M_dataplus)._M_p,&local_d8);
        pRVar3 = pRVar3 + 1;
      } while (!bVar4);
      return bVar2;
    }
    bVar2 = cmsys::RegularExpression::find(pRVar3,(name->_M_dataplus)._M_p,&local_d8);
    pRVar3 = pRVar3 + 1;
  } while (!bVar2);
  return false;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name)
{
  cmsys::RegularExpressionMatch match;

  for (auto const& regex : this->PostIncludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return false;
    }
  }

  for (auto const& regex : this->PostExcludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return true;
    }
  }

  return false;
}